

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecSet.h
# Opt level: O1

int Vec_SetAppend(Vec_Set_t *p,int *pArray,int nSize)

{
  int iVar1;
  word **ppwVar2;
  word *pwVar3;
  word wVar4;
  int iVar5;
  size_t __size;
  
  iVar5 = nSize + 1 >> 1;
  iVar1 = 1 << ((byte)p->nPageSize & 0x1f);
  if (iVar5 < iVar1) {
    p->nEntries = p->nEntries + 1;
    ppwVar2 = p->pPages;
    if (iVar1 <= (int)*ppwVar2[p->iPage] + iVar5) {
      iVar1 = p->iPage + 1;
      p->iPage = iVar1;
      if (iVar1 == p->nPagesAlloc) {
        __size = (long)p->nPagesAlloc << 4;
        if (ppwVar2 == (word **)0x0) {
          ppwVar2 = (word **)malloc(__size);
        }
        else {
          ppwVar2 = (word **)realloc(ppwVar2,__size);
        }
        p->pPages = ppwVar2;
        iVar1 = p->nPagesAlloc;
        memset(ppwVar2 + iVar1,0,(long)iVar1 << 3);
        p->nPagesAlloc = iVar1 * 2;
      }
      ppwVar2 = p->pPages;
      iVar1 = p->iPage;
      if (ppwVar2[iVar1] == (word *)0x0) {
        pwVar3 = (word *)malloc((0x100000000 << ((byte)p->nPageSize & 0x3f)) >> 0x1d);
        ppwVar2[iVar1] = pwVar3;
      }
      pwVar3 = p->pPages[iVar1];
      *pwVar3 = 2;
      pwVar3[1] = 0xffffffffffffffff;
    }
    if (pArray != (int *)0x0) {
      memcpy(p->pPages[p->iPage] + (int)*p->pPages[p->iPage],pArray,(long)nSize << 2);
    }
    iVar1 = p->iPage;
    wVar4 = (long)iVar5 + *p->pPages[iVar1];
    *p->pPages[iVar1] = wVar4;
    return ((int)wVar4 - iVar5) + (iVar1 << ((byte)p->nPageSize & 0x1f));
  }
  __assert_fail("nWords < (1 << p->nPageSize)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecSet.h"
                ,0xd8,"int Vec_SetAppend(Vec_Set_t *, int *, int)");
}

Assistant:

static inline int Vec_SetAppend( Vec_Set_t * p, int * pArray, int nSize )
{
    int nWords = Vec_SetWordNum( nSize );
    assert( nWords < (1 << p->nPageSize) );
    p->nEntries++;
    if ( Vec_SetLimit( p->pPages[p->iPage] ) + nWords >= (1 << p->nPageSize) )
    {
        if ( ++p->iPage == p->nPagesAlloc )
        {
            p->pPages = ABC_REALLOC( word *, p->pPages, p->nPagesAlloc * 2 );
            memset( p->pPages + p->nPagesAlloc, 0, sizeof(word *) * (size_t)p->nPagesAlloc );
            p->nPagesAlloc *= 2;
        }
        if ( p->pPages[p->iPage] == NULL )
            p->pPages[p->iPage] = ABC_ALLOC( word, (int)(((word)1) << p->nPageSize) );
        Vec_SetWriteLimit( p->pPages[p->iPage], 2 );
        p->pPages[p->iPage][1] = ~0;
    }
    if ( pArray )
        memcpy( p->pPages[p->iPage] + Vec_SetLimit(p->pPages[p->iPage]), pArray, sizeof(int) * (size_t)nSize );
    Vec_SetIncLimit( p->pPages[p->iPage], nWords );
    return Vec_SetHandCurrent(p) - nWords;
}